

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O0

FM_OPL * OPLCreate(UINT32 clock,UINT32 rate,int type)

{
  int iVar1;
  int local_34;
  int state_size;
  FM_OPL *OPL;
  char *ptr;
  int type_local;
  UINT32 rate_local;
  UINT32 clock_local;
  
  iVar1 = OPL_LockTable();
  if (iVar1 == -1) {
    _rate_local = (FM_OPL *)0x0;
  }
  else {
    local_34 = 0x17d8;
    if ((type & 2U) != 0) {
      local_34 = 0x1878;
    }
    _rate_local = (FM_OPL *)calloc(1,(long)local_34);
    if (_rate_local == (FM_OPL *)0x0) {
      _rate_local = (FM_OPL *)0x0;
    }
    else {
      if ((type & 2U) != 0) {
        _rate_local->deltat = (YM_DELTAT *)(_rate_local + 1);
      }
      _rate_local->type = (UINT8)type;
      OPL_clock_changed(_rate_local,clock,rate);
      opl_set_mute_mask(_rate_local,0);
    }
  }
  return _rate_local;
}

Assistant:

static FM_OPL *OPLCreate(UINT32 clock, UINT32 rate, int type)
{
	char *ptr;
	FM_OPL *OPL;
	int state_size;

	if (OPL_LockTable() == -1) return NULL;

	/* calculate OPL state size */
	state_size  = sizeof(FM_OPL);

#if BUILD_Y8950
	if (type&OPL_TYPE_ADPCM) state_size+= sizeof(YM_DELTAT);
#endif

	/* allocate memory block */
	ptr = (char *)calloc(1, state_size);
	if (ptr==NULL)
		return NULL;

	OPL  = (FM_OPL *)ptr;

	ptr += sizeof(FM_OPL);

#if BUILD_Y8950
	if (type&OPL_TYPE_ADPCM)
	{
		OPL->deltat = (YM_DELTAT *)ptr;
		ptr += sizeof(YM_DELTAT);
	}
#endif

	OPL->type  = type;
	OPL_clock_changed(OPL, clock, rate);

	opl_set_mute_mask(OPL, 0x0000);

	return OPL;
}